

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tls.c
# Opt level: O0

void test_tls(void)

{
  ulong uVar1;
  undefined1 local_e0 [8];
  thread_local_t tls;
  tp_task_t *task;
  thread_pool_t tp;
  int i;
  
  uVar1 = tp_init(&task,5);
  if ((uVar1 & 1) == 0) {
    __assert_fail("tp_init(&tp, 5)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_tls.c"
                  ,0x3a,"void test_tls()");
  }
  uVar1 = tp_start(&task);
  if ((uVar1 & 1) == 0) {
    __assert_fail("tp_start(&tp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_tls.c"
                  ,0x3b,"void test_tls()");
  }
  tls.task = (tp_task_t *)tp_task_create(tls_create,tls_cleanup,0);
  if (tls.task == (tp_task_t *)0x0) {
    __assert_fail("task",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_tls.c"
                  ,0x3e,"void test_tls()");
  }
  uVar1 = tp_tls_init(local_e0,tls.task);
  if ((uVar1 & 1) == 0) {
    __assert_fail("tp_tls_init(&tls, task)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_tls.c"
                  ,0x3f,"void test_tls()");
  }
  tp.no_task.__data.__g_signals[1] = 0;
  while( true ) {
    if (9 < (int)tp.no_task.__data.__g_signals[1]) {
      tp_join_tasks(&task);
      tp_destroy(&task);
      return;
    }
    tls.task = (tp_task_t *)tp_task_create(task_func,0,local_e0);
    if (tls.task == (tp_task_t *)0x0) break;
    tp_post_task(&task,tls.task);
    tp.no_task.__data.__g_signals[1] = tp.no_task.__data.__g_signals[1] + 1;
  }
  __assert_fail("task",
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_tls.c"
                ,0x43,"void test_tls()");
}

Assistant:

void test_tls()
{
    int i;
    thread_pool_t tp;
    tp_task_t *task;
    thread_local_t tls;

    assert(tp_init(&tp, 5));
    assert(tp_start(&tp));

    task = tp_task_create(tls_create, tls_cleanup, NULL, 0);
    assert(task);
    assert(tp_tls_init(&tls, task));

    for (i = 0; i < LEN; ++i) {
        task = tp_task_create(task_func, NULL, &tls, 0);
        assert(task);
        tp_post_task(&tp, task);
    }

    tp_join_tasks(&tp);
    tp_destroy(&tp);
}